

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_compression.cpp
# Opt level: O1

idx_t duckdb::DictionaryCompressionStorage::StringFinalAnalyze(AnalyzeState *state_p)

{
  idx_t iVar1;
  BlockManager *pBVar2;
  long lVar3;
  bitpacking_width_t packing_width;
  type pDVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  bitpacking_width_t bVar8;
  ulong uVar9;
  float fVar10;
  
  pDVar4 = unique_ptr<duckdb::DictionaryAnalyzeState,_std::default_delete<duckdb::DictionaryAnalyzeState>,_true>
           ::operator*((unique_ptr<duckdb::DictionaryAnalyzeState,_std::default_delete<duckdb::DictionaryAnalyzeState>,_true>
                        *)(state_p + 1));
  iVar1 = pDVar4->current_unique_count;
  uVar9 = iVar1 + 1;
  lVar3 = 0x3f;
  if (uVar9 != 0) {
    for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  bVar8 = '@';
  if (uVar9 >> 0x38 == 0) {
    bVar8 = '@' - ((byte)lVar3 ^ 0x3f);
  }
  packing_width = '\0';
  if (iVar1 != 0xffffffffffffffff) {
    packing_width = bVar8;
  }
  iVar5 = DictionaryCompression::RequiredSpace
                    (pDVar4->current_tuple_count,iVar1,pDVar4->current_dict_size,packing_width);
  pBVar2 = (pDVar4->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
  iVar1 = pDVar4->segment_count;
  iVar6 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar7 = optional_idx::GetIndex(&pBVar2->block_header_size);
  fVar10 = (float)((iVar6 - iVar7) * iVar1 + iVar5) * 1.2;
  uVar9 = (ulong)fVar10;
  return (long)(fVar10 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
}

Assistant:

idx_t DictionaryCompressionStorage::StringFinalAnalyze(AnalyzeState &state_p) {
	auto &analyze_state = state_p.Cast<DictionaryCompressionAnalyzeState>();
	auto &state = *analyze_state.analyze_state;

	auto width = BitpackingPrimitives::MinimumBitWidth(state.current_unique_count + 1);
	auto req_space = DictionaryCompression::RequiredSpace(state.current_tuple_count, state.current_unique_count,
	                                                      state.current_dict_size, width);

	const auto total_space = state.segment_count * state.info.GetBlockSize() + req_space;
	return LossyNumericCast<idx_t>(DictionaryCompression::MINIMUM_COMPRESSION_RATIO * float(total_space));
}